

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colTrie.c
# Opt level: O1

int Col_TrieMapUnset(Col_Word map,Col_Word key)

{
  uint uVar1;
  int iVar2;
  ulong in_RAX;
  ulong uVar3;
  Col_Word grandParent;
  Col_Word parent;
  byte *local_28;
  Col_Word local_20;
  
  if (map == 0) {
    uVar1 = 0;
  }
  else if ((map & 0xf) == 0) {
    uVar1 = *(byte *)map & 0xfffffffe;
    in_RAX = (ulong)uVar1;
    uVar1 = -(uint)((*(byte *)map & 2) == 0) | uVar1;
  }
  else {
    in_RAX = (ulong)((uint)map & 0x1f);
    uVar1 = immediateWordTypes[in_RAX];
  }
  if (uVar1 == 0xffffffff) {
    in_RAX = TrieMapFindNode(map,key,0,(int *)0x0,(Col_Word *)&local_28,&local_20,(Col_Word *)0x0,
                             (Col_Word *)0x0,(size_t *)0x0,(size_t *)0x0);
  }
  else if (uVar1 == 0x42) {
    in_RAX = StringTrieMapFindNode
                       (map,key,0,(int *)0x0,(Col_Word *)&local_28,&local_20,(Col_Word *)0x0,
                        (Col_Word *)0x0,(size_t *)0x0,(Col_Char *)0x0);
  }
  if (in_RAX == 0) {
    iVar2 = 0;
  }
  else {
    *(long *)(map + 0x10) = *(long *)(map + 0x10) + -1;
    if (local_28 == (byte *)0x0) {
      *(undefined8 *)(map + 0x18) = 0;
    }
    else {
      uVar3 = *(ulong *)(local_20 + 0x18);
      if (in_RAX == uVar3) {
        uVar3 = *(ulong *)(local_20 + 0x10);
      }
      if (local_28 == (byte *)map) {
        *(ulong *)(map + 0x18) = uVar3;
      }
      else {
        if (((ulong)local_28 & 0xf) == 0) {
          uVar1 = -(uint)((*local_28 & 2) == 0) | *local_28 & 0xfffffffe;
        }
        else {
          uVar1 = immediateWordTypes[(uint)local_28 & 0x1f];
        }
        if (uVar1 != 0x56) {
          local_28 = (byte *)ConvertStringNodeToMutable((Col_Word)local_28,map,key);
        }
        if (*(Col_Word *)(local_28 + 0x10) == local_20) {
          *(ulong *)(local_28 + 0x10) = uVar3;
        }
        else {
          *(ulong *)(local_28 + 0x18) = uVar3;
        }
      }
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
Col_TrieMapUnset(
    Col_Word map,   /*!< Trie map to remove entry from. */
    Col_Word key)   /*!< Entry key. Can be any word type, including string,
                         however it must match the actual type used by the
                         map. */
{
    Col_Word node, grandParent, parent, sibling;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_WORDTRIEMAP,map} */
    TYPECHECK_WORDTRIEMAP(map) return 0;

    switch (WORD_TYPE(map)) {
    case WORD_TYPE_STRTRIEMAP:
        node = StringTrieMapFindNode(map, key, 0, NULL, &grandParent, &parent,
                NULL, NULL, NULL, NULL);
        break;

    case WORD_TYPE_CUSTOM:
        node = TrieMapFindNode(map, key, 0, NULL, &grandParent, &parent, NULL,
                NULL, NULL, NULL);
        break;

    /* WORD_TYPE_UNKNOWN */

    default:
        /* CANTHAPPEN */
        ASSERT(0);
    }

    if (!node) {
        /*
         * Not found.
         */

        return 0;
    }

    WORD_TRIEMAP_SIZE(map)--;

    if (!grandParent) {
        /*
         * Last entry.
         */

        ASSERT(parent == map);
        ASSERT(WORD_TRIEMAP_ROOT(map) == node);
        ASSERT(WORD_TRIEMAP_SIZE(map) == 0);
        WORD_TRIEMAP_ROOT(map) = WORD_NIL;

        return 1;
    }

    /*
     * Replace parent by sibling.
     */

    ASSERT(WORD_TYPE(parent) == WORD_TYPE_STRTRIENODE || WORD_TYPE(parent) == WORD_TYPE_MSTRTRIENODE);
    if (node == WORD_TRIENODE_RIGHT(parent)) {
        sibling = WORD_TRIENODE_LEFT(parent);
    } else {
        sibling = WORD_TRIENODE_RIGHT(parent);
    }
    if (grandParent == map) {
        /*
         * Parent was root.
         */

        ASSERT(WORD_TRIEMAP_ROOT(map) == parent);
        WORD_TRIEMAP_ROOT(map) = sibling;
    } else {
        if (WORD_TYPE(grandParent) != WORD_TYPE_MSTRTRIENODE) {
            /*
             * Grandparent is immutable, convert first.
             */

            ASSERT(WORD_TYPE(grandParent) == WORD_TYPE_STRTRIENODE);
            grandParent = ConvertStringNodeToMutable(grandParent, map, key);
        }
        ASSERT(WORD_TYPE(grandParent) == WORD_TYPE_MSTRTRIENODE);
        if (WORD_TRIENODE_LEFT(grandParent) == parent) {
            WORD_TRIENODE_LEFT(grandParent) = sibling;
        } else {
            WORD_TRIENODE_RIGHT(grandParent) = sibling;
        }
    }

    return 1;
}